

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

bool __thiscall wasm::Type::isDefaultable(Type *this)

{
  ulong uVar1;
  bool bVar2;
  Type *pTVar3;
  Type *pTVar4;
  Type *pTVar5;
  undefined1 local_40 [8];
  Iterator __begin2;
  Type t;
  
  uVar1 = this->id;
  if ((uVar1 & 1) == 0 || uVar1 < 7) {
    if (1 < uVar1) {
      return (uVar1 & 3) != 0 || uVar1 < 7;
    }
    return false;
  }
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  local_40 = (undefined1  [8])this;
  pTVar3 = (Type *)size(this);
  if (pTVar3 == (Type *)0x0) {
    bVar2 = true;
  }
  else {
    pTVar4 = (Type *)0x1;
    do {
      pTVar5 = pTVar4;
      pTVar4 = Iterator::operator*((Iterator *)local_40);
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
           pTVar4->id;
      bVar2 = isDefaultable((Type *)&__begin2.
                                     super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                     .index);
      if (!bVar2) {
        return bVar2;
      }
      pTVar4 = (Type *)((long)&pTVar5->id + 1);
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar5;
    } while (pTVar5 != pTVar3);
  }
  return bVar2;
}

Assistant:

constexpr bool isBasic() const { return id <= _last_basic_type; }